

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

size_t __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintBArrayValues
          (ConvertToolPrivate *this,char *tagData,size_t tagDataLength)

{
  bool bVar1;
  __type _Var2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  void *this_00;
  ulong in_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  float fVar8;
  uint32_t i;
  size_t index;
  uint32_t arrayLength;
  undefined8 in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  allocator local_c9;
  string local_c8 [36];
  uint local_a4;
  size_t local_a0;
  uint local_98;
  undefined1 local_92;
  allocator local_91;
  string local_90 [67];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  ulong local_18;
  undefined1 *local_10;
  
  if (in_RDX < 5) {
    local_4d = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Incomplete array tag data",&local_39);
    BadDataException::BadDataException
              ((BadDataException *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
    local_4d = 0;
    __cxa_throw(uVar7,&BadDataException::typeinfo,BadDataException::~BadDataException);
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffeb8);
  if (_Var2) {
    switch(*local_10) {
    case 0x43:
      std::operator<<((ostream *)(in_RDI + 0x20),"C,");
      break;
    default:
      local_92 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"Unknown B array type: ",&local_91);
      std::operator+(in_stack_fffffffffffffea8,(char)((ulong)in_stack_fffffffffffffea0 >> 0x38));
      BadDataException::BadDataException
                ((BadDataException *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffea8);
      local_92 = 0;
      __cxa_throw(uVar7,&BadDataException::typeinfo,BadDataException::~BadDataException);
    case 0x49:
      std::operator<<((ostream *)(in_RDI + 0x20),"I,");
      break;
    case 0x53:
      std::operator<<((ostream *)(in_RDI + 0x20),"S,");
      break;
    case 99:
      std::operator<<((ostream *)(in_RDI + 0x20),"c,");
      break;
    case 0x66:
      std::operator<<((ostream *)(in_RDI + 0x20),"f,");
      break;
    case 0x69:
      std::operator<<((ostream *)(in_RDI + 0x20),"i,");
      break;
    case 0x73:
      std::operator<<((ostream *)(in_RDI + 0x20),"s,");
    }
  }
  local_98 = UnpackUnsignedInt(local_10 + 1);
  local_a0 = 5;
  local_a4 = 0;
  switch(*local_10) {
  case 0x43:
    for (local_a4 = 0; local_a4 < local_98 && local_a0 + 1 <= local_18; local_a4 = local_a4 + 1) {
      if (local_a4 != 0) {
        std::operator<<((ostream *)(in_RDI + 0x20),',');
      }
      std::ostream::operator<<((void *)(in_RDI + 0x20),(uint)(byte)local_10[local_a0]);
      local_a0 = local_a0 + 1;
    }
    break;
  case 0x49:
    for (local_a4 = 0; local_a4 < local_98 && local_a0 + 4 <= local_18; local_a4 = local_a4 + 1) {
      if (local_a4 != 0) {
        std::operator<<((ostream *)(in_RDI + 0x20),',');
      }
      this_00 = (void *)(in_RDI + 0x20);
      uVar6 = UnpackUnsignedInt(local_10 + local_a0);
      std::ostream::operator<<(this_00,uVar6);
      local_a0 = local_a0 + 4;
    }
    break;
  case 0x53:
    for (local_a4 = 0; local_a4 < local_98 && local_a0 + 2 <= local_18; local_a4 = local_a4 + 1) {
      if (local_a4 != 0) {
        std::operator<<((ostream *)(in_RDI + 0x20),',');
      }
      uVar4 = UnpackUnsignedShort(local_10 + local_a0);
      std::ostream::operator<<((void *)(in_RDI + 0x20),uVar4);
      local_a0 = local_a0 + 2;
    }
    break;
  case 99:
    for (local_a4 = 0; local_a4 < local_98 && local_a0 + 1 <= local_18; local_a4 = local_a4 + 1) {
      if (local_a4 != 0) {
        std::operator<<((ostream *)(in_RDI + 0x20),',');
      }
      std::ostream::operator<<((void *)(in_RDI + 0x20),(int)(char)local_10[local_a0]);
      local_a0 = local_a0 + 1;
    }
    break;
  case 0x66:
    for (local_a4 = 0; bVar1 = local_a0 + 4 <= local_18,
        in_stack_fffffffffffffeb7 = local_a4 < local_98 && bVar1, local_a4 < local_98 && bVar1;
        local_a4 = local_a4 + 1) {
      if (local_a4 != 0) {
        std::operator<<((ostream *)(in_RDI + 0x20),',');
      }
      in_stack_fffffffffffffea8 = (string *)(in_RDI + 0x20);
      fVar8 = UnpackFloat(local_10 + local_a0);
      std::ostream::operator<<(in_stack_fffffffffffffea8,fVar8);
      local_a0 = local_a0 + 4;
    }
    break;
  case 0x69:
    for (local_a4 = 0; local_a4 < local_98 && local_a0 + 4 <= local_18; local_a4 = local_a4 + 1) {
      if (local_a4 != 0) {
        std::operator<<((ostream *)(in_RDI + 0x20),',');
      }
      iVar5 = UnpackSignedInt(local_10 + local_a0);
      std::ostream::operator<<((void *)(in_RDI + 0x20),iVar5);
      local_a0 = local_a0 + 4;
    }
    break;
  case 0x73:
    for (local_a4 = 0; local_a4 < local_98 && local_a0 + 2 <= local_18; local_a4 = local_a4 + 1) {
      if (local_a4 != 0) {
        std::operator<<((ostream *)(in_RDI + 0x20),',');
      }
      sVar3 = UnpackSignedShort(local_10 + local_a0);
      std::ostream::operator<<((void *)(in_RDI + 0x20),sVar3);
      local_a0 = local_a0 + 2;
    }
  }
  if (local_a4 < local_98) {
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Incomplete array tag data",&local_c9);
    BadDataException::BadDataException
              ((BadDataException *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
    __cxa_throw(uVar7,&BadDataException::typeinfo,BadDataException::~BadDataException);
  }
  return local_a0;
}

Assistant:

std::size_t ConvertTool::ConvertToolPrivate::PrintBArrayValues(const char* tagData,
                                                               std::size_t tagDataLength)
{
    // Need at least 5 bytes for type and array length
    if (tagDataLength < 5) {
        throw BadDataException("Incomplete array tag data");
    }

    if (m_settings->Format == FORMAT_SAM) {
        // Print array type letter
        switch (tagData[0]) {
            case (Constants::BAM_TAG_TYPE_INT8):
                m_out << "c,";
                break;
            case (Constants::BAM_TAG_TYPE_UINT8):
                m_out << "C,";
                break;
            case (Constants::BAM_TAG_TYPE_INT16):
                m_out << "s,";
                break;
            case (Constants::BAM_TAG_TYPE_UINT16):
                m_out << "S,";
                break;
            case (Constants::BAM_TAG_TYPE_INT32):
                m_out << "i,";
                break;
            case (Constants::BAM_TAG_TYPE_UINT32):
                m_out << "I,";
                break;
            case (Constants::BAM_TAG_TYPE_FLOAT):
                m_out << "f,";
                break;
            default:
                throw BadDataException(std::string("Unknown B array type: ") + tagData[0]);
        }
    }

    uint32_t arrayLength = BamTools::UnpackUnsignedInt(&tagData[1]);
    std::size_t index = 1 + sizeof(uint32_t);
    uint32_t i = 0;

    // Print array values.
    switch (tagData[0]) {
        case (Constants::BAM_TAG_TYPE_INT8):
            for (i = 0; i < arrayLength && index + sizeof(int8_t) <= tagDataLength;
                 i++, index += sizeof(int8_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << int(static_cast<int8_t>(tagData[index]));
            }
            break;

        case (Constants::BAM_TAG_TYPE_UINT8):
            for (i = 0; i < arrayLength && index + sizeof(uint8_t) <= tagDataLength;
                 i++, index += sizeof(uint8_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << int(static_cast<uint8_t>(tagData[index]));
            }
            break;

        case (Constants::BAM_TAG_TYPE_INT16):
            for (i = 0; i < arrayLength && index + sizeof(int16_t) <= tagDataLength;
                 i++, index += sizeof(int16_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackSignedShort(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_UINT16):
            for (i = 0; i < arrayLength && index + sizeof(uint16_t) <= tagDataLength;
                 i++, index += sizeof(uint16_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackUnsignedShort(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_INT32):
            for (i = 0; i < arrayLength && index + sizeof(int32_t) <= tagDataLength;
                 i++, index += sizeof(int32_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackSignedInt(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_UINT32):
            for (i = 0; i < arrayLength && index + sizeof(uint32_t) <= tagDataLength;
                 i++, index += sizeof(uint32_t)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackUnsignedInt(&tagData[index]);
            }
            break;

        case (Constants::BAM_TAG_TYPE_FLOAT):
            for (i = 0; i < arrayLength && index + sizeof(float) <= tagDataLength;
                 i++, index += sizeof(float)) {
                if (i > 0) {
                    m_out << ',';
                }
                m_out << BamTools::UnpackFloat(&tagData[index]);
            }
            break;
    }
    if (i < arrayLength) {
        throw BadDataException("Incomplete array tag data");
    }

    return index;
}